

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::ConvertCluster
          (FBXConverter *this,vector<aiBone_*,_std::allocator<aiBone_*>_> *bones,Model *param_2,
          Cluster *cl,vector<unsigned_long,_std::allocator<unsigned_long>_> *out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *index_out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *count_out_indices,
          aiMatrix4x4 *node_global_transform)

{
  pointer *pppaVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  pointer puVar18;
  pointer puVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  aiBone *paVar32;
  ulong uVar33;
  aiVertexWeight *__s;
  long lVar34;
  iterator __position;
  unsigned_long uVar35;
  ulong uVar36;
  unsigned_long uVar37;
  long lVar38;
  aiBone *bone;
  aiBone *local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  string local_50;
  
  local_70 = index_out_indices;
  paVar32 = (aiBone *)operator_new(0x450);
  (paVar32->mName).length = 0;
  (paVar32->mName).data[0] = '\0';
  memset((paVar32->mName).data + 1,0x1b,0x3ff);
  paVar32->mNumWeights = 0;
  paVar32->mWeights = (aiVertexWeight *)0x0;
  (paVar32->mOffsetMatrix).a1 = 1.0;
  (paVar32->mOffsetMatrix).a2 = 0.0;
  (paVar32->mOffsetMatrix).a3 = 0.0;
  (paVar32->mOffsetMatrix).a4 = 0.0;
  (paVar32->mOffsetMatrix).b1 = 0.0;
  (paVar32->mOffsetMatrix).b2 = 1.0;
  (paVar32->mOffsetMatrix).b3 = 0.0;
  (paVar32->mOffsetMatrix).b4 = 0.0;
  (paVar32->mOffsetMatrix).c1 = 0.0;
  (paVar32->mOffsetMatrix).c2 = 0.0;
  (paVar32->mOffsetMatrix).c3 = 1.0;
  (paVar32->mOffsetMatrix).c4 = 0.0;
  (paVar32->mOffsetMatrix).d1 = 0.0;
  (paVar32->mOffsetMatrix).d2 = 0.0;
  (paVar32->mOffsetMatrix).d3 = 0.0;
  (paVar32->mOffsetMatrix).d4 = 1.0;
  __position._M_current =
       (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_78 = paVar32;
  if (__position._M_current ==
      (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiBone*,std::allocator<aiBone*>>::_M_realloc_insert<aiBone*const&>
              ((vector<aiBone*,std::allocator<aiBone*>> *)bones,__position,&local_78);
  }
  else {
    *__position._M_current = paVar32;
    pppaVar1 = &(bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  FixNodeName(&local_50,(FBXConverter *)__position._M_current,&(cl->node->super_Object).name);
  paVar32 = local_78;
  if (local_50._M_string_length < 0x400) {
    (local_78->mName).length = (ai_uint32)local_50._M_string_length;
    memcpy((local_78->mName).data,local_50._M_dataplus._M_p,local_50._M_string_length);
    (paVar32->mName).data[local_50._M_string_length] = '\0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  fVar13 = (cl->transformLink).a1;
  fVar14 = (cl->transformLink).a2;
  fVar15 = (cl->transformLink).a3;
  fVar16 = (cl->transformLink).a4;
  fVar9 = (cl->transformLink).b1;
  fVar10 = (cl->transformLink).b2;
  fVar11 = (cl->transformLink).b3;
  fVar12 = (cl->transformLink).b4;
  fVar5 = (cl->transformLink).c1;
  fVar6 = (cl->transformLink).c2;
  fVar7 = (cl->transformLink).c3;
  fVar8 = (cl->transformLink).c4;
  fVar2 = (cl->transformLink).d2;
  fVar3 = (cl->transformLink).d3;
  fVar4 = (cl->transformLink).d4;
  (local_78->mOffsetMatrix).d1 = (cl->transformLink).d1;
  (local_78->mOffsetMatrix).d2 = fVar2;
  (local_78->mOffsetMatrix).d3 = fVar3;
  (local_78->mOffsetMatrix).d4 = fVar4;
  (local_78->mOffsetMatrix).c1 = fVar5;
  (local_78->mOffsetMatrix).c2 = fVar6;
  (local_78->mOffsetMatrix).c3 = fVar7;
  (local_78->mOffsetMatrix).c4 = fVar8;
  (local_78->mOffsetMatrix).b1 = fVar9;
  (local_78->mOffsetMatrix).b2 = fVar10;
  (local_78->mOffsetMatrix).b3 = fVar11;
  (local_78->mOffsetMatrix).b4 = fVar12;
  (local_78->mOffsetMatrix).a1 = fVar13;
  (local_78->mOffsetMatrix).a2 = fVar14;
  (local_78->mOffsetMatrix).a3 = fVar15;
  (local_78->mOffsetMatrix).a4 = fVar16;
  aiMatrix4x4t<float>::Inverse(&local_78->mOffsetMatrix);
  paVar32 = local_78;
  fVar2 = (local_78->mOffsetMatrix).a1;
  fVar3 = (local_78->mOffsetMatrix).a2;
  fVar4 = (local_78->mOffsetMatrix).a3;
  fVar5 = (local_78->mOffsetMatrix).a4;
  fVar20 = node_global_transform->a1;
  fVar21 = node_global_transform->a2;
  fVar22 = node_global_transform->a3;
  fVar23 = node_global_transform->a4;
  fVar24 = node_global_transform->b1;
  fVar25 = node_global_transform->b2;
  fVar26 = node_global_transform->b3;
  fVar27 = node_global_transform->b4;
  fVar28 = node_global_transform->c1;
  fVar29 = node_global_transform->c2;
  fVar30 = node_global_transform->c3;
  fVar31 = node_global_transform->c4;
  local_68 = node_global_transform->d1;
  fStack_64 = node_global_transform->d2;
  fStack_60 = node_global_transform->d3;
  fStack_5c = node_global_transform->d4;
  fVar6 = (local_78->mOffsetMatrix).b2;
  fVar7 = (local_78->mOffsetMatrix).b1;
  fVar8 = (local_78->mOffsetMatrix).b3;
  fVar9 = (local_78->mOffsetMatrix).b4;
  fVar10 = (local_78->mOffsetMatrix).c2;
  fVar11 = (local_78->mOffsetMatrix).c1;
  fVar12 = (local_78->mOffsetMatrix).c3;
  fVar13 = (local_78->mOffsetMatrix).c4;
  fVar14 = (local_78->mOffsetMatrix).d2;
  fVar15 = (local_78->mOffsetMatrix).d1;
  fVar16 = (local_78->mOffsetMatrix).d3;
  fVar17 = (local_78->mOffsetMatrix).d4;
  (local_78->mOffsetMatrix).a1 = fVar5 * local_68 + fVar4 * fVar28 + fVar2 * fVar20 + fVar3 * fVar24
  ;
  (local_78->mOffsetMatrix).a2 =
       fVar5 * fStack_64 + fVar4 * fVar29 + fVar2 * fVar21 + fVar3 * fVar25;
  (local_78->mOffsetMatrix).a3 =
       fVar5 * fStack_60 + fVar4 * fVar30 + fVar2 * fVar22 + fVar3 * fVar26;
  (local_78->mOffsetMatrix).a4 =
       fVar5 * fStack_5c + fVar4 * fVar31 + fVar2 * fVar23 + fVar3 * fVar27;
  (local_78->mOffsetMatrix).b1 = fVar9 * local_68 + fVar8 * fVar28 + fVar7 * fVar20 + fVar6 * fVar24
  ;
  (local_78->mOffsetMatrix).b2 =
       fVar9 * fStack_64 + fVar8 * fVar29 + fVar7 * fVar21 + fVar6 * fVar25;
  (local_78->mOffsetMatrix).b3 =
       fVar9 * fStack_60 + fVar8 * fVar30 + fVar7 * fVar22 + fVar6 * fVar26;
  (local_78->mOffsetMatrix).b4 =
       fVar9 * fStack_5c + fVar8 * fVar31 + fVar7 * fVar23 + fVar6 * fVar27;
  (local_78->mOffsetMatrix).c1 =
       fVar13 * local_68 + fVar12 * fVar28 + fVar11 * fVar20 + fVar10 * fVar24;
  (local_78->mOffsetMatrix).c2 =
       fVar13 * fStack_64 + fVar12 * fVar29 + fVar11 * fVar21 + fVar10 * fVar25;
  (local_78->mOffsetMatrix).c3 =
       fVar13 * fStack_60 + fVar12 * fVar30 + fVar11 * fVar22 + fVar10 * fVar26;
  (local_78->mOffsetMatrix).c4 =
       fVar13 * fStack_5c + fVar12 * fVar31 + fVar11 * fVar23 + fVar10 * fVar27;
  (local_78->mOffsetMatrix).d1 =
       fVar17 * local_68 + fVar16 * fVar28 + fVar15 * fVar20 + fVar14 * fVar24;
  (local_78->mOffsetMatrix).d2 =
       fVar17 * fStack_64 + fVar16 * fVar29 + fVar15 * fVar21 + fVar14 * fVar25;
  (local_78->mOffsetMatrix).d3 =
       fVar17 * fStack_60 + fVar16 * fVar30 + fVar15 * fVar22 + fVar14 * fVar26;
  (local_78->mOffsetMatrix).d4 =
       fVar17 * fStack_5c + fVar16 * fVar31 + fVar15 * fVar23 + fVar14 * fVar27;
  local_78->mNumWeights =
       (uint)((ulong)((long)(out_indices->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(out_indices->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
  puVar18 = (out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_start;
  puVar19 = (out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  uVar33 = (long)puVar19 - (long)puVar18;
  uVar36 = 0xffffffffffffffff;
  if (-1 < (long)uVar33) {
    uVar36 = uVar33;
  }
  __s = (aiVertexWeight *)operator_new__(uVar36);
  lVar38 = (long)puVar19 - (long)puVar18;
  if (lVar38 != 0) {
    memset(__s,0,(lVar38 - 8U & 0xfffffffffffffff8) + 8);
  }
  paVar32->mWeights = __s;
  lVar38 = (long)(local_70->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_70->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar38 != 0) {
    lVar38 = lVar38 >> 3;
    lVar34 = 0;
    do {
      uVar35 = (local_70->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start[lVar34];
      if (uVar35 != 0xffffffffffffffff) {
        for (uVar37 = (count_out_indices->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar34]; uVar37 != 0; uVar37 = uVar37 - 1) {
          __s->mVertexId =
               (uint)(out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar35];
          __s->mWeight = (cl->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar34];
          __s = __s + 1;
          uVar35 = uVar35 + 1;
        }
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 != lVar38 + (ulong)(lVar38 == 0));
  }
  return;
}

Assistant:

void FBXConverter::ConvertCluster(std::vector<aiBone*>& bones, const Model& /*model*/, const Cluster& cl,
            std::vector<size_t>& out_indices,
            std::vector<size_t>& index_out_indices,
            std::vector<size_t>& count_out_indices,
            const aiMatrix4x4& node_global_transform)
        {

            aiBone* const bone = new aiBone();
            bones.push_back(bone);

            bone->mName = FixNodeName(cl.TargetNode()->Name());

            bone->mOffsetMatrix = cl.TransformLink();
            bone->mOffsetMatrix.Inverse();

            bone->mOffsetMatrix = bone->mOffsetMatrix * node_global_transform;

            bone->mNumWeights = static_cast<unsigned int>(out_indices.size());
            aiVertexWeight* cursor = bone->mWeights = new aiVertexWeight[out_indices.size()];

            const size_t no_index_sentinel = std::numeric_limits<size_t>::max();
            const WeightArray& weights = cl.GetWeights();

            const size_t c = index_out_indices.size();
            for (size_t i = 0; i < c; ++i) {
                const size_t index_index = index_out_indices[i];

                if (index_index == no_index_sentinel) {
                    continue;
                }

                const size_t cc = count_out_indices[i];
                for (size_t j = 0; j < cc; ++j) {
                    aiVertexWeight& out_weight = *cursor++;

                    out_weight.mVertexId = static_cast<unsigned int>(out_indices[index_index + j]);
                    out_weight.mWeight = weights[i];
                }
            }
        }